

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint64_t expectedUnits;
  void *pvVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  bool bVar14;
  WeightParamType WVar15;
  long *plVar16;
  undefined1 *puVar17;
  size_type *psVar18;
  Result *_result;
  uint uVar19;
  undefined1 *puVar20;
  uint uVar21;
  char cVar22;
  undefined1 *puVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  bool bVar25;
  bool bVar26;
  string err;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar14 = Result::good(__return_storage_ptr__);
  if (!bVar14) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar24 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar24) {
    operator_delete(pcVar3,paVar24->_M_allocated_capacity + 1);
  }
  if (!bVar14) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar14 = Result::good(__return_storage_ptr__);
  if (!bVar14) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar24) {
    operator_delete(pcVar3,paVar24->_M_allocated_capacity + 1);
  }
  if (!bVar14) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_78 = paVar24;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Batchnorm","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    paVar24 = local_78;
    bVar14 = Result::good(__return_storage_ptr__);
    if (!bVar14) {
      return __return_storage_ptr__;
    }
    plVar16 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar16 != paVar24) {
      operator_delete(plVar16,paVar24->_M_allocated_capacity + 1);
    }
    if (!bVar14) {
      return __return_storage_ptr__;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Batchnorm","");
    validateRankCount(__return_storage_ptr__,layer,&local_98,3,-1,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar14 = Result::good(__return_storage_ptr__);
    if (!bVar14) {
      return __return_storage_ptr__;
    }
    plVar16 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar16 != paVar24) {
      operator_delete(plVar16,paVar24->_M_allocated_capacity + 1);
    }
    if (!bVar14) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    puVar20 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar20 = Specification::_BatchnormLayerParams_default_instance_;
  }
  puVar17 = (undefined1 *)(((ActivationParams *)puVar20)->NonlinearityType_).parametricsoftplus_;
  if ((ActivationParametricSoftplus *)puVar17 == (ActivationParametricSoftplus *)0x0) {
    puVar17 = Specification::_WeightParams_default_instance_;
  }
  iVar1 = *(int *)&((ActivationParametricSoftplus *)puVar17)->alpha_;
  lVar4 = *(long *)((*(ulong *)&((ActivationParametricSoftplus *)puVar17)->_cached_size_ &
                    0xfffffffffffffffe) + 8);
  uVar21 = (0 < iVar1) + 1;
  if (lVar4 == 0) {
    uVar21 = (uint)(0 < iVar1);
  }
  lVar5 = *(long *)(((ulong)(((ActivationParametricSoftplus *)((long)puVar17 + 0x28))->
                            super_MessageLite)._vptr_MessageLite & 0xfffffffffffffffe) + 8);
  lVar6 = *(long *)(((((ActivationParametricSoftplus *)((long)puVar17 + 0x28))->super_MessageLite).
                     _internal_metadata_.ptr_ & 0xfffffffffffffffeU) + 8);
  uVar11 = (uint)(lVar6 == 0);
  uVar21 = (uVar21 - (lVar5 == 0)) + 2;
  if (((uVar21 - uVar11 < 2) &&
      ((uVar21 == uVar11) != ((0 < iVar1 || lVar4 != 0) || uVar21 == uVar11))) && (0 < iVar1)) {
LAB_00355ba5:
    bVar14 = false;
  }
  else {
    puVar23 = (undefined1 *)((InnerProductLayerParams *)puVar20)->bias_;
    if ((WeightParams *)puVar23 == (WeightParams *)0x0) {
      puVar23 = Specification::_WeightParams_default_instance_;
    }
    iVar2 = (((WeightParams *)puVar23)->floatvalue_).current_size_;
    lVar7 = *(long *)(((ulong)(((WeightParams *)puVar23)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar19 = (0 < iVar2) + 1;
    if (lVar7 == 0) {
      uVar19 = (uint)(0 < iVar2);
    }
    uVar12 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar23)->int8rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0);
    uVar19 = (uVar19 - (*(long *)(((ulong)(((WeightParams *)puVar23)->rawvalue_).tagged_ptr_.ptr_ &
                                  0xfffffffffffffffe) + 8) == 0)) + 2;
    if (((uVar19 - uVar12 < 2) &&
        ((uVar19 == uVar12) != ((0 < iVar2 || lVar7 != 0) || uVar19 == uVar12))) && (0 < iVar2))
    goto LAB_00355ba5;
    puVar23 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
    if ((WeightParams *)puVar23 == (WeightParams *)0x0) {
      puVar23 = Specification::_WeightParams_default_instance_;
    }
    iVar2 = (((WeightParams *)puVar23)->floatvalue_).current_size_;
    lVar7 = *(long *)(((ulong)(((WeightParams *)puVar23)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar19 = (0 < iVar2) + 1;
    if (lVar7 == 0) {
      uVar19 = (uint)(0 < iVar2);
    }
    uVar12 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar23)->int8rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0);
    uVar19 = (uVar19 - (*(long *)(((ulong)(((WeightParams *)puVar23)->rawvalue_).tagged_ptr_.ptr_ &
                                  0xfffffffffffffffe) + 8) == 0)) + 2;
    if (((uVar19 - uVar12 < 2) &&
        ((uVar19 == uVar12) != ((0 < iVar2 || lVar7 != 0) || uVar19 == uVar12))) && (0 < iVar2))
    goto LAB_00355ba5;
    puVar23 = (undefined1 *)((BatchnormLayerParams *)puVar20)->variance_;
    if ((WeightParams *)puVar23 == (WeightParams *)0x0) {
      puVar23 = Specification::_WeightParams_default_instance_;
    }
    iVar2 = (((WeightParams *)puVar23)->floatvalue_).current_size_;
    lVar7 = *(long *)(((ulong)(((WeightParams *)puVar23)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar19 = (0 < iVar2) + 1;
    if (lVar7 == 0) {
      uVar19 = (uint)(0 < iVar2);
    }
    uVar12 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar23)->int8rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0);
    uVar19 = (uVar19 - (*(long *)(((ulong)(((WeightParams *)puVar23)->rawvalue_).tagged_ptr_.ptr_ &
                                  0xfffffffffffffffe) + 8) == 0)) + 2;
    bVar14 = true;
    if (uVar19 - uVar12 < 2) {
      bVar14 = uVar19 == uVar12 || (iVar2 < 1 || lVar7 == 0 && iVar2 < 1);
    }
  }
  cVar22 = '\x04';
  if (uVar21 - uVar11 < 2) {
    cVar22 = '\x05';
    if (uVar21 != uVar11) {
      cVar22 = iVar1 < 1;
    }
    if (((((lVar4 == 0) && (uVar21 != uVar11)) && (iVar1 < 1)) &&
        (((lVar5 == 0 || (puVar17 == Specification::_WeightParams_default_instance_)) ||
         (cVar22 = '\x02',
         ((ActivationParametricSoftplus *)((long)puVar17 + 0x28))->alpha_ == (WeightParams *)0x0))))
       && (((lVar6 == 0 || (puVar17 == Specification::_WeightParams_default_instance_)) ||
           (cVar22 = '\x03',
           ((ActivationParametricSoftplus *)((long)puVar17 + 0x28))->alpha_ == (WeightParams *)0x0))
          )) {
      cVar22 = '\x05';
    }
  }
  if (cVar22 == '\x01') {
LAB_00355ca1:
    bVar26 = false;
  }
  else {
    puVar17 = (undefined1 *)((InnerProductLayerParams *)puVar20)->bias_;
    if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
      puVar17 = Specification::_WeightParams_default_instance_;
    }
    iVar1 = (((WeightParams *)puVar17)->floatvalue_).current_size_;
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar17)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar21 = (0 < iVar1) + 1;
    if (lVar4 == 0) {
      uVar21 = (uint)(0 < iVar1);
    }
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar17)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar6 = *(long *)(((ulong)(((WeightParams *)puVar17)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar11 = (uint)(lVar6 == 0);
    uVar21 = (uVar21 - (lVar5 == 0)) + 2;
    cVar22 = '\x04';
    if (uVar21 - uVar11 < 2) {
      cVar22 = '\x05';
      if (uVar21 != uVar11) {
        cVar22 = iVar1 < 1;
      }
      if (((((lVar4 == 0) && (uVar21 != uVar11)) && (iVar1 < 1)) &&
          (((lVar5 == 0 || (puVar17 == Specification::_WeightParams_default_instance_)) ||
           (cVar22 = '\x02', ((WeightParams *)puVar17)->quantization_ == (QuantizationParams *)0x0))
          )) && (((lVar6 == 0 || (puVar17 == Specification::_WeightParams_default_instance_)) ||
                 (cVar22 = '\x03',
                 ((WeightParams *)puVar17)->quantization_ == (QuantizationParams *)0x0)))) {
        cVar22 = '\x05';
      }
    }
    if (cVar22 == '\x01') goto LAB_00355ca1;
    puVar17 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
    if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
      puVar17 = Specification::_WeightParams_default_instance_;
    }
    iVar1 = (((WeightParams *)puVar17)->floatvalue_).current_size_;
    lVar4 = *(long *)(((ulong)(((WeightParams *)puVar17)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar21 = (0 < iVar1) + 1;
    if (lVar4 == 0) {
      uVar21 = (uint)(0 < iVar1);
    }
    lVar5 = *(long *)(((ulong)(((WeightParams *)puVar17)->rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    lVar6 = *(long *)(((ulong)(((WeightParams *)puVar17)->int8rawvalue_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar11 = (uint)(lVar6 == 0);
    uVar21 = (uVar21 - (lVar5 == 0)) + 2;
    cVar22 = '\x04';
    if (uVar21 - uVar11 < 2) {
      cVar22 = '\x05';
      if (uVar21 != uVar11) {
        cVar22 = iVar1 < 1;
      }
      if (((((lVar4 == 0) && (uVar21 != uVar11)) && (iVar1 < 1)) &&
          (((lVar5 == 0 || (puVar17 == Specification::_WeightParams_default_instance_)) ||
           (cVar22 = '\x02', ((WeightParams *)puVar17)->quantization_ == (QuantizationParams *)0x0))
          )) && (((lVar6 == 0 || (puVar17 == Specification::_WeightParams_default_instance_)) ||
                 (cVar22 = '\x03',
                 ((WeightParams *)puVar17)->quantization_ == (QuantizationParams *)0x0)))) {
        cVar22 = '\x05';
      }
    }
    if (cVar22 == '\x01') goto LAB_00355ca1;
    puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->variance_;
    if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
      puVar20 = Specification::_WeightParams_default_instance_;
    }
    WVar15 = valueType((WeightParams *)puVar20);
    bVar26 = WVar15 != FLOAT16;
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    puVar20 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar20 = Specification::_BatchnormLayerParams_default_instance_;
  }
  puVar17 = (undefined1 *)(((ActivationParams *)puVar20)->NonlinearityType_).linear_;
  if ((ActivationLinear *)puVar17 == (ActivationLinear *)0x0) {
    puVar17 = Specification::_WeightParams_default_instance_;
  }
  bVar25 = 0 < (int)((ActivationLinear *)puVar17)->alpha_;
  uVar21 = bVar25 + 1;
  if (*(long *)(((ulong)(((ActivationLinear *)((long)puVar17 + 0x20))->super_MessageLite).
                        _vptr_MessageLite & 0xfffffffffffffffe) + 8) == 0) {
    uVar21 = (uint)bVar25;
  }
  uVar8._0_4_ = ((ActivationLinear *)((long)puVar17 + 0x20))->alpha_;
  uVar8._4_4_ = ((ActivationLinear *)((long)puVar17 + 0x20))->beta_;
  bVar25 = true;
  if (((uVar21 - (*(long *)(((((ActivationLinear *)((long)puVar17 + 0x20))->super_MessageLite).
                             _internal_metadata_.ptr_ & 0xfffffffffffffffeU) + 8) == 0)) + 2) -
      (uint)(*(long *)((uVar8 & 0xfffffffffffffffe) + 8) == 0) < 2) {
    puVar17 = (undefined1 *)((InnerProductLayerParams *)puVar20)->bias_;
    if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
      puVar17 = Specification::_WeightParams_default_instance_;
    }
    uVar21 = (uint)(0 < (((WeightParams *)puVar17)->floatvalue_).current_size_);
    uVar11 = uVar21 + 1;
    if (*(long *)(((ulong)(((WeightParams *)puVar17)->float16value_).tagged_ptr_.ptr_ &
                  0xfffffffffffffffe) + 8) == 0) {
      uVar11 = uVar21;
    }
    if (((uVar11 - (*(long *)(((ulong)(((WeightParams *)puVar17)->rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0)) + 2) -
        (uint)(*(long *)(((ulong)(((WeightParams *)puVar17)->int8rawvalue_).tagged_ptr_.ptr_ &
                         0xfffffffffffffffe) + 8) == 0) < 2) {
      puVar17 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
      if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
        puVar17 = Specification::_WeightParams_default_instance_;
      }
      bVar10 = 0 < (((WeightParams *)puVar17)->floatvalue_).current_size_;
      uVar21 = bVar10 + 1;
      if (*(long *)(((ulong)(((WeightParams *)puVar17)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8) == 0) {
        uVar21 = (uint)bVar10;
      }
      if (((uVar21 - (*(long *)(((ulong)(((WeightParams *)puVar17)->rawvalue_).tagged_ptr_.ptr_ &
                                0xfffffffffffffffe) + 8) == 0)) + 2) -
          (uint)(*(long *)(((ulong)(((WeightParams *)puVar17)->int8rawvalue_).tagged_ptr_.ptr_ &
                           0xfffffffffffffffe) + 8) == 0) < 2) {
        puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->variance_;
        if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
          puVar20 = Specification::_WeightParams_default_instance_;
        }
        WVar15 = valueType((WeightParams *)puVar20);
        bVar25 = WVar15 == UNSPECIFIED;
      }
    }
  }
  if ((bVar25) || (!bVar14 && !bVar26)) {
    std::operator+(&local_70,"Batchnorm layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar18 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_98.field_2._M_allocated_capacity = *psVar18;
      local_98.field_2._8_8_ = plVar16[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar18;
      local_98._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_98._M_string_length = plVar16[1];
    *plVar16 = (long)psVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar20 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar20 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar17 = (undefined1 *)(((ActivationParams *)puVar20)->NonlinearityType_).linear_;
    if ((WeightParams *)puVar17 == (WeightParams *)0x0) {
      puVar17 = Specification::_WeightParams_default_instance_;
    }
    expectedUnits = ((BatchnormLayerParams *)puVar20)->channels_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_78 = paVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
    pvVar9 = (layer->name_).tagged_ptr_.ptr_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"gamma","");
    validateGeneralWeightParams
              (__return_storage_ptr__,(WeightParams *)puVar17,expectedUnits,1,&local_98,
               (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_70);
    paVar24 = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar14 = Result::good(__return_storage_ptr__);
    if (!bVar14) {
      return __return_storage_ptr__;
    }
    plVar16 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar16 != paVar24) {
      operator_delete(plVar16,paVar24->_M_allocated_capacity + 1);
    }
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar20 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar20 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar20 = (undefined1 *)((InnerProductLayerParams *)puVar20)->bias_;
    if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
      puVar20 = Specification::_WeightParams_default_instance_;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
    pvVar9 = (layer->name_).tagged_ptr_.ptr_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"beta","");
    validateGeneralWeightParams
              (__return_storage_ptr__,(WeightParams *)puVar20,expectedUnits,1,&local_98,
               (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_70);
    paVar13 = local_78;
    paVar24 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar24) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar14 = Result::good(__return_storage_ptr__);
    if (!bVar14) {
      return __return_storage_ptr__;
    }
    plVar16 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar16 != paVar13) {
      operator_delete(plVar16,paVar13->_M_allocated_capacity + 1);
    }
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar20 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar20 = Specification::_BatchnormLayerParams_default_instance_;
    }
    if (((BatchnormLayerParams *)puVar20)->computemeanvar_ != false) {
LAB_0035625a:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
    if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
      puVar20 = Specification::_WeightParams_default_instance_;
    }
    WVar15 = valueType((WeightParams *)puVar20);
    if (WVar15 != EMPTY) {
      if (layer->_oneof_case_[0] == 0xa0) {
        puVar20 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar20 = Specification::_BatchnormLayerParams_default_instance_;
      }
      puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
      if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
        puVar20 = Specification::_WeightParams_default_instance_;
      }
      WVar15 = valueType((WeightParams *)puVar20);
      if (WVar15 != EMPTY) {
        if (layer->_oneof_case_[0] == 0xa0) {
          puVar20 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar20 = Specification::_BatchnormLayerParams_default_instance_;
        }
        puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
        if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
          puVar20 = Specification::_WeightParams_default_instance_;
        }
        local_98._M_dataplus._M_p = (pointer)paVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
        pvVar9 = (layer->name_).tagged_ptr_.ptr_;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"mean","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar20,expectedUnits,1,&local_98,
                   (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_70);
        paVar13 = local_78;
        paVar24 = &local_98.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar24) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        bVar14 = Result::good(__return_storage_ptr__);
        if (!bVar14) {
          return __return_storage_ptr__;
        }
        plVar16 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar16 != paVar13) {
          operator_delete(plVar16,paVar13->_M_allocated_capacity + 1);
        }
        if (layer->_oneof_case_[0] == 0xa0) {
          puVar20 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar20 = Specification::_BatchnormLayerParams_default_instance_;
        }
        puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->variance_;
        if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
          puVar20 = Specification::_WeightParams_default_instance_;
        }
        local_98._M_dataplus._M_p = (pointer)paVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
        pvVar9 = (layer->name_).tagged_ptr_.ptr_;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"variance","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar20,expectedUnits,1,&local_98,
                   (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_70);
        paVar13 = local_78;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar24) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        bVar14 = Result::good(__return_storage_ptr__);
        if (!bVar14) {
          return __return_storage_ptr__;
        }
        plVar16 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar16 != paVar13) {
          operator_delete(plVar16,paVar13->_M_allocated_capacity + 1);
        }
        goto LAB_0035625a;
      }
    }
    std::operator+(&local_70,"Batchnorm layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar18 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_98.field_2._M_allocated_capacity = *psVar18;
      local_98.field_2._8_8_ = plVar16[3];
      local_98._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar18;
      local_98._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_98._M_string_length = plVar16[1];
    *plVar16 = (long)psVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar24) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank));
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta"));

    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance"));
    }
    return Result();
}